

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_snode(lyout *out,int level,lys_node *node,int mask)

{
  LYS_NODE LVar1;
  int mask_local;
  lys_node *node_local;
  int level_local;
  lyout *out_local;
  
  if ((node->nodetype & mask) != LYS_UNKNOWN) {
    if (((node->nodetype & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) && ((node->flags & 0x40) != 0)) {
      return;
    }
    if (((node->parent == (lys_node *)0x0) ||
        ((node->parent->nodetype == LYS_AUGMENT && (node != node->parent->child)))) ||
       ((node->parent->nodetype != LYS_AUGMENT && (node->prev->next != (lys_node *)0x0)))) {
      ly_print(out,"\n");
    }
  }
  LVar1 = node->nodetype & mask;
  if (LVar1 == LYS_CONTAINER) {
    yang_print_container(out,level,node);
    return;
  }
  if (LVar1 == LYS_CHOICE) {
    yang_print_choice(out,level,node);
    return;
  }
  if (LVar1 == LYS_LEAF) {
    yang_print_leaf(out,level,node);
    return;
  }
  if (LVar1 == LYS_LEAFLIST) {
    yang_print_leaflist(out,level,node);
    return;
  }
  if (LVar1 == LYS_LIST) {
    yang_print_list(out,level,node);
    return;
  }
  if (LVar1 == LYS_ANYXML) {
LAB_001c9121:
    yang_print_anydata(out,level,node);
  }
  else {
    if (LVar1 == LYS_CASE) {
      yang_print_case(out,level,node);
      return;
    }
    if (LVar1 == LYS_NOTIF) {
      yang_print_notif(out,level,node);
      return;
    }
    if (LVar1 != LYS_RPC) {
      if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) {
        yang_print_input_output(out,level,node);
        return;
      }
      if (LVar1 == LYS_GROUPING) {
        yang_print_grouping(out,level,node);
        return;
      }
      if (LVar1 == LYS_USES) {
        yang_print_uses(out,level,node);
        return;
      }
      if (LVar1 != LYS_ACTION) {
        if (LVar1 != LYS_ANYDATA) {
          return;
        }
        goto LAB_001c9121;
      }
    }
    yang_print_rpc_action(out,level,node);
  }
  return;
}

Assistant:

static void
yang_print_snode(struct lyout *out, int level, const struct lys_node *node, int mask)
{
    if (node->nodetype & mask) {
        if ((node->nodetype & (LYS_INPUT | LYS_OUTPUT)) && (node->flags & LYS_IMPLICIT)) {
            /* implicit input/output node is not supposed to be printed */
            return;
        } else if (!node->parent ||
                (node->parent->nodetype == LYS_AUGMENT && node != node->parent->child) ||
                (node->parent->nodetype != LYS_AUGMENT && node->prev->next)) {
            /* do not print the blank line before the first data-def node */
            ly_print(out, "\n");
        }
    }

    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
        yang_print_container(out, level, node);
        break;
    case LYS_CHOICE:
        yang_print_choice(out, level, node);
        break;
    case LYS_LEAF:
        yang_print_leaf(out, level, node);
        break;
    case LYS_LEAFLIST:
        yang_print_leaflist(out, level, node);
        break;
    case LYS_LIST:
        yang_print_list(out, level, node);
        break;
    case LYS_USES:
        yang_print_uses(out, level, node);
        break;
    case LYS_GROUPING:
        yang_print_grouping(out, level, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yang_print_anydata(out, level, node);
        break;
    case LYS_CASE:
        yang_print_case(out, level, node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        yang_print_rpc_action(out, level, node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        yang_print_input_output(out, level, node);
        break;
    case LYS_NOTIF:
        yang_print_notif(out, level, node);
        break;
    default:
        break;
    }
}